

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O3

void DES_ecb3_encrypt_ex(uint8_t *in,uint8_t *out,DES_key_schedule *ks1,DES_key_schedule *ks2,
                        DES_key_schedule *ks3,int enc)

{
  undefined8 local_10;
  
  local_10 = *(undefined8 *)in;
  if (enc == 0) {
    DES_decrypt3((uint *)&local_10,(DES_key_schedule *)ks1,(DES_key_schedule *)ks2,
                 (DES_key_schedule *)ks3);
  }
  else {
    DES_encrypt3((uint *)&local_10,(DES_key_schedule *)ks1,(DES_key_schedule *)ks2,
                 (DES_key_schedule *)ks3);
  }
  *(undefined8 *)out = local_10;
  return;
}

Assistant:

void DES_ecb3_encrypt_ex(const uint8_t in[8], uint8_t out[8],
                         const DES_key_schedule *ks1,
                         const DES_key_schedule *ks2,
                         const DES_key_schedule *ks3, int enc) {
  uint32_t ll[2];
  ll[0] = CRYPTO_load_u32_le(in);
  ll[1] = CRYPTO_load_u32_le(in + 4);
  if (enc) {
    DES_encrypt3(ll, ks1, ks2, ks3);
  } else {
    DES_decrypt3(ll, ks1, ks2, ks3);
  }
  CRYPTO_store_u32_le(out, ll[0]);
  CRYPTO_store_u32_le(out + 4, ll[1]);
}